

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setSizeIncrement(QWidget *this,int w,int h)

{
  QWidgetPrivate *this_00;
  QTLWExtra *pQVar1;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  pQVar1 = QWidgetPrivate::topData(this_00);
  if ((pQVar1->incw != w) || (pQVar1->inch != h)) {
    pQVar1->incw = (short)w;
    pQVar1->inch = (short)h;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      QWidgetPrivate::setConstraints_sys(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QWidget::setSizeIncrement(int w, int h)
{
    Q_D(QWidget);
    d->createTLExtra();
    QTLWExtra* x = d->topData();
    if (x->incw == w && x->inch == h)
        return;
    x->incw = w;
    x->inch = h;
    if (isWindow())
        d->setConstraints_sys();
}